

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

Var Js::JavascriptNumber::ToVarIntCheck(double value,ScriptContext *scriptContext)

{
  BOOL BVar1;
  Var pvVar2;
  undefined1 *puVar3;
  
  puVar3 = &DAT_1000000000000;
  if ((value != 0.0) || (NAN(value))) {
    if ((value != 1.0) || (NAN(value))) {
      if (((double)(int)value != value) || (NAN((double)(int)value) || NAN(value))) {
        pvVar2 = ToVar(value);
        return pvVar2;
      }
      puVar3 = (undefined1 *)((ulong)(uint)(int)value | 0x1000000000000);
    }
    else {
      puVar3 = &DAT_1000000000001;
    }
  }
  else {
    BVar1 = IsNegZero(value);
    if (BVar1 != 0) {
      puVar3 = (undefined1 *)
               (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).negativeZero.ptr;
    }
  }
  return puVar3;
}

Assistant:

Var JavascriptNumber::ToVarIntCheck(double value,ScriptContext* scriptContext)
    {
        //
        // Check if a well-known value:
        // - This significantly cuts down on the below floating-point to integer conversions.
        //

        if (value == 0.0)
        {
            if(IsNegZero(value))
            {
                return scriptContext->GetLibrary()->GetNegativeZero();
            }
            return TaggedInt::ToVarUnchecked(0);
        }
        if (value == 1.0)
        {
            return TaggedInt::ToVarUnchecked(1);
        }

        //
        // Check if number can be reduced back into a TaggedInt:
        // - This avoids extra GC.
        //

        int nValue      = (int) value;
        double dblCheck = (double) nValue;
        if ((dblCheck == value) && (!TaggedInt::IsOverflow(nValue)))
        {
            return TaggedInt::ToVarUnchecked(nValue);
        }

        return JavascriptNumber::NewInlined(value,scriptContext);
    }